

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O1

IntrinsicResult intrinsic_remove(Context *context,IntrinsicResult partialResult)

{
  int iVar1;
  long *plVar2;
  undefined4 *puVar3;
  char *__filename;
  String path;
  long *local_68;
  char local_60;
  long *local_58;
  anon_union_8_3_2f476f46_for_data local_50;
  Value local_48;
  undefined1 local_38 [8];
  long *local_30;
  
  local_60 = '\0';
  plVar2 = (long *)operator_new(0x30);
  plVar2[1] = 1;
  *plVar2 = (long)&PTR__StringStorage_001d10b0;
  plVar2[3] = 5;
  plVar2[4] = -1;
  puVar3 = (undefined4 *)operator_new__(5);
  plVar2[2] = (long)puVar3;
  *(undefined1 *)(puVar3 + 1) = 0;
  *puVar3 = 0x68746170;
  local_68 = plVar2;
  MiniScript::Context::GetVar
            ((Context *)local_38,(String *)partialResult.rs,(LocalOnlyMode)&local_68);
  MiniScript::Value::ToString((Value *)&local_58,(Machine *)local_38);
  if ((2 < local_38[0]) && (local_30 != (long *)0x0)) {
    plVar2 = local_30 + 1;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (**(code **)(*local_30 + 8))();
    }
    local_30 = (long *)0x0;
  }
  if ((local_68 != (long *)0x0) && (local_60 == '\0')) {
    plVar2 = local_68 + 1;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (**(code **)(*local_68 + 8))();
    }
    local_68 = (long *)0x0;
  }
  if (local_58 == (long *)0x0) {
    __filename = "";
  }
  else {
    __filename = (char *)local_58[2];
  }
  iVar1 = remove(__filename);
  MiniScript::Value::Truth(&local_48,iVar1 == 0);
  (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
  MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
  MiniScript::Value::operator=
            ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
             &local_48);
  *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
  if ((Temp < local_48.type) && (local_48.data.ref != (RefCountedStorage *)0x0)) {
    plVar2 = &(local_48.data.ref)->refCount;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (*(local_48.data.ref)->_vptr_RefCountedStorage[1])();
    }
    local_48.data.number = 0.0;
  }
  if ((local_58 != (long *)0x0) && (local_50.tempNum._0_1_ == '\0')) {
    plVar2 = local_58 + 1;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (**(code **)(*local_58 + 8))();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_remove(Context *context, IntrinsicResult partialResult) {
	String path = context->GetVar("path").ToString();
	#if _WIN32 || _WIN64
		bool isDir = false;
		struct _stati64 stats;
		if (_stati64(path.c_str(), &stats) == 0) {
			isDir = ((stats.st_mode & _S_IFDIR) != 0);
		}
		bool ok;
		if (isDir) ok = RemoveDirectory(path.c_str());
		else ok = DeleteFile(path.c_str());
		int err = ok ? 0 : 1;
	#else
		int err = remove(path.c_str());
	#endif
	return IntrinsicResult(Value::Truth(err == 0));
}